

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::format_data(function<void_(const_void_*,_unsigned_long)> *write_data,iovec *iovs,
                       size_t num_iovs,uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,
                       uint64_t flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  runtime_error *this;
  long *plVar13;
  logic_error *plVar14;
  size_type sVar15;
  char *pcVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  bool local_2e1;
  bool local_2c9;
  function<void_(const_void_*,_unsigned_long)> local_298;
  undefined1 local_278 [8];
  InverseTerminalGuard g2;
  undefined1 local_230 [8];
  RedBoldTerminalGuard g1;
  uint8_t previous_value_1;
  ulong uStack_200;
  uint8_t current_value_1;
  size_t x_5;
  string field;
  undefined1 local_1b8 [8];
  RedBoldTerminalGuard g;
  uint8_t previous_value;
  ulong uStack_188;
  uint8_t current_value;
  size_t x_4;
  string line;
  size_t x_3;
  size_t x_2;
  anon_class_56_7_59e222cb print_fields_column;
  long lStack_110;
  uint8_t line_bytes;
  long local_108;
  byte local_f9;
  long lStack_f8;
  uint8_t line_invalid_end_bytes;
  long local_f0;
  byte local_e1;
  ulong uStack_e0;
  uint8_t line_invalid_start_bytes;
  uint64_t line_end_address;
  uint64_t line_start_address;
  size_t prev_iov_bytes;
  size_t prev_iov_index;
  size_t current_iov_bytes;
  size_t current_iov_index;
  uint8_t *prev_line_data;
  uint8_t prev_line_buf [16];
  uint8_t line_buf [16];
  undefined1 local_7d [8];
  bool skip_separator;
  bool collapse_zero_lines;
  bool little_endian;
  bool big_endian;
  bool reverse_endian;
  bool print_double;
  bool print_float;
  bool print_ascii;
  bool use_color;
  int width_digits;
  uint64_t end_address;
  ulong local_58;
  size_t x_1;
  size_t total_prev_size;
  size_t x;
  size_t total_size;
  size_t num_prev_iovs_local;
  iovec *prev_iovs_local;
  uint64_t start_address_local;
  size_t num_iovs_local;
  iovec *iovs_local;
  function<void_(const_void_*,_unsigned_long)> *write_data_local;
  
  if (num_iovs != 0) {
    x = 0;
    for (total_prev_size = 0; total_prev_size < num_iovs; total_prev_size = total_prev_size + 1) {
      x = iovs[total_prev_size].iov_len + x;
    }
    if (x != 0) {
      total_size = num_prev_iovs;
      num_prev_iovs_local = (size_t)prev_iovs;
      prev_iovs_local = (iovec *)start_address;
      start_address_local = num_iovs;
      num_iovs_local = (size_t)iovs;
      iovs_local = (iovec *)write_data;
      if (num_prev_iovs != 0) {
        x_1 = 0;
        for (local_58 = 0; local_58 < num_prev_iovs; local_58 = local_58 + 1) {
          x_1 = prev_iovs[local_58].iov_len + x_1;
        }
        if (x_1 != x) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this,"previous iovs given, but data size does not match");
          __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      _print_double = start_address + x;
      if ((flags & 0x100) == 0) {
        if ((flags & 0x200) == 0) {
          if ((flags & 0x400) == 0) {
            if ((flags & 0x800) == 0) {
              if (_print_double < 0x100000001) {
                if (_print_double < 0x10001) {
                  if (_print_double < 0x101) {
                    _collapse_zero_lines = 2;
                  }
                  else {
                    _collapse_zero_lines = 4;
                  }
                }
                else {
                  _collapse_zero_lines = 8;
                }
              }
              else {
                _collapse_zero_lines = 0x10;
              }
            }
            else {
              _collapse_zero_lines = 0x10;
            }
          }
          else {
            _collapse_zero_lines = 8;
          }
        }
        else {
          _collapse_zero_lines = 4;
        }
      }
      else {
        _collapse_zero_lines = 2;
      }
      skip_separator = (flags & 1) != 0;
      local_7d[7] = (flags & 2) != 0;
      local_7d[6] = (flags & 4) != 0;
      local_7d[5] = (flags & 8) != 0;
      local_7d[4] = (flags & 0x10) != 0;
      local_7d[3] = (flags & 0x1000) != 0;
      local_7d[2] = (flags & 0x2000) != 0;
      local_7d[1] = (flags & 0x20) != 0;
      local_7d[0] = (flags & 0x40) != 0;
      memset(prev_line_buf + 8,0,0x10);
      current_iov_index = (size_t)&prev_line_data;
      if (total_size == 0) {
        current_iov_index = (size_t)(prev_line_buf + 8);
      }
      else {
        memset(&prev_line_data,0,0x10);
      }
      current_iov_bytes = 0;
      prev_iov_index = 0;
      prev_iov_bytes = 0;
      line_start_address = 0;
      for (line_end_address = (ulong)prev_iovs_local & 0xfffffffffffffff0;
          line_end_address < _print_double; line_end_address = line_end_address + 0x10) {
        uStack_e0 = line_end_address + 0x10;
        local_f0 = (long)prev_iovs_local - line_end_address;
        lStack_f8 = 0;
        plVar13 = ::std::max<long>(&local_f0,&stack0xffffffffffffff08);
        local_e1 = (byte)*plVar13;
        local_108 = uStack_e0 - _print_double;
        lStack_110 = 0;
        plVar13 = ::std::max<long>(&local_108,&stack0xfffffffffffffef0);
        local_f9 = (byte)*plVar13;
        print_fields_column.use_color._7_1_ = ('\x10' - local_f9) - local_e1;
        print_fields_column.write_data = (function<void_(const_void_*,_unsigned_long)> *)local_7d;
        print_fields_column.skip_separator = (bool *)(prev_line_buf + 8);
        print_fields_column.line_buf = (uint8_t (*) [16])&current_iov_index;
        print_fields_column.prev_line_data = (uint8_t **)&local_e1;
        print_fields_column.line_invalid_start_bytes = &local_f9;
        print_fields_column.line_invalid_end_bytes = &skip_separator;
        for (x_3 = 0; x_2 = (size_t)write_data, x_3 < print_fields_column.use_color._7_1_;
            x_3 = x_3 + 1) {
          while (*(ulong *)(num_iovs_local + current_iov_bytes * 0x10 + 8) <= prev_iov_index) {
            prev_iov_index = 0;
            current_iov_bytes = current_iov_bytes + 1;
            if (start_address_local <= current_iov_bytes) {
              plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
              ::std::logic_error::logic_error(plVar14,"reads exceeded final iov");
              __cxa_throw(plVar14,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
            }
          }
          prev_line_buf[x_3 + local_e1 + 8] =
               *(uint8_t *)(*(long *)(num_iovs_local + current_iov_bytes * 0x10) + prev_iov_index);
          prev_iov_index = prev_iov_index + 1;
        }
        if (total_size != 0) {
          for (line.field_2._8_8_ = 0;
              (ulong)line.field_2._8_8_ < (ulong)print_fields_column.use_color._7_1_;
              line.field_2._8_8_ = line.field_2._8_8_ + 1) {
            while (*(ulong *)(num_prev_iovs_local + prev_iov_bytes * 0x10 + 8) <= line_start_address
                  ) {
              line_start_address = 0;
              prev_iov_bytes = prev_iov_bytes + 1;
              if (total_size <= prev_iov_bytes) {
                plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
                ::std::logic_error::logic_error(plVar14,"reads exceeded final prev iov");
                __cxa_throw(plVar14,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
              }
            }
            prev_line_buf[line.field_2._8_8_ + (ulong)local_e1 + -8] =
                 *(uint8_t *)
                  (*(long *)(num_prev_iovs_local + prev_iov_bytes * 0x10) + line_start_address);
            line_start_address = line_start_address + 1;
          }
        }
        if ((((local_7d[1] & 1) == 0) || (line_end_address <= prev_iovs_local)) ||
           (_print_double <= uStack_e0)) {
LAB_00115596:
          pcVar16 = "%0*lX |";
          if ((local_7d[0] & 1) != 0) {
            pcVar16 = "%0*lX";
          }
          string_printf_abi_cxx11_
                    ((string *)&x_4,pcVar16,(ulong)(uint)_collapse_zero_lines,line_end_address);
          pcVar16 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                              ((string *)&x_4);
          sVar15 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::size((string *)&x_4);
          ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,pcVar16,sVar15)
          ;
          for (uStack_188 = 0; uStack_188 < local_e1; uStack_188 = uStack_188 + 1) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"   ",3);
          }
          for (; uStack_188 < (ulong)(long)(int)(0x10 - (uint)local_f9); uStack_188 = uStack_188 + 1
              ) {
            g._39_1_ = prev_line_buf[uStack_188 + 8];
            g._38_1_ = *(undefined1 *)(current_iov_index + uStack_188);
            ::std::function<void_(const_void_*,_unsigned_long)>::function
                      ((function<void_(const_void_*,_unsigned_long)> *)((long)&field.field_2 + 8),
                       write_data);
            local_2c9 = (skip_separator & 1U) != 0 && g._38_1_ != g._39_1_;
            RedBoldTerminalGuard::RedBoldTerminalGuard
                      ((RedBoldTerminalGuard *)local_1b8,
                       (function<void_(const_void_*,_unsigned_long)> *)((long)&field.field_2 + 8),
                       local_2c9);
            ::std::function<void_(const_void_*,_unsigned_long)>::~function
                      ((function<void_(const_void_*,_unsigned_long)> *)((long)&field.field_2 + 8));
            string_printf_abi_cxx11_((string *)&x_5," %02X",(ulong)(byte)g._39_1_);
            pcVar16 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&x_5);
            sVar15 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&x_5);
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                      (write_data,pcVar16,sVar15);
            ::std::__cxx11::string::~string((string *)&x_5);
            RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b8);
          }
          for (; uStack_188 < 0x10; uStack_188 = uStack_188 + 1) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"   ",3);
          }
          if ((local_7d[7] & 1) != 0) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                      (write_data," | ",(ulong)((byte)~local_7d[0] & 1) * 2 + 1);
            for (uStack_200 = 0; uStack_200 < local_e1; uStack_200 = uStack_200 + 1) {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
            }
            for (; uStack_200 < (ulong)(long)(int)(0x10 - (uint)local_f9);
                uStack_200 = uStack_200 + 1) {
              g1._39_1_ = prev_line_buf[uStack_200 + 8];
              g1._38_1_ = *(undefined1 *)(current_iov_index + uStack_200);
              ::std::function<void_(const_void_*,_unsigned_long)>::function
                        ((function<void_(const_void_*,_unsigned_long)> *)&g2.active,write_data);
              local_2e1 = (skip_separator & 1U) != 0 && g1._38_1_ != g1._39_1_;
              RedBoldTerminalGuard::RedBoldTerminalGuard
                        ((RedBoldTerminalGuard *)local_230,
                         (function<void_(const_void_*,_unsigned_long)> *)&g2.active,local_2e1);
              ::std::function<void_(const_void_*,_unsigned_long)>::~function
                        ((function<void_(const_void_*,_unsigned_long)> *)&g2.active);
              if (((byte)g1._39_1_ < 0x20) || (0x7e < (byte)g1._39_1_)) {
                ::std::function<void_(const_void_*,_unsigned_long)>::function(&local_298,write_data)
                ;
                InverseTerminalGuard::InverseTerminalGuard
                          ((InverseTerminalGuard *)local_278,&local_298,(bool)(skip_separator & 1));
                ::std::function<void_(const_void_*,_unsigned_long)>::~function(&local_298);
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
                InverseTerminalGuard::~InverseTerminalGuard((InverseTerminalGuard *)local_278);
              }
              else {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,&g1.field_0x27,1);
              }
              RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_230);
            }
            for (; uStack_200 < 0x10; uStack_200 = uStack_200 + 1) {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
            }
          }
          if ((local_7d[6] & 1) != 0) {
            if ((local_7d[4] & 1) == 0) {
              if ((local_7d[3] & 1) == 0) {
                if ((local_7d[2] & 1) == 0) {
                  format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                  ::$_0::operator()((__0 *)&x_2," %12.5g","             ",0xd);
                }
                else {
                  format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                  ::$_0::operator()((__0 *)&x_2," %12.5g","             ",0xd);
                }
              }
              else {
                format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                ::$_0::operator()((__0 *)&x_2," %12.5g","             ",0xd);
              }
            }
            else {
              format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
              ::$_0::operator()((__0 *)&x_2," %12.5g","             ",0xd);
            }
          }
          if ((local_7d[5] & 1) != 0) {
            if ((local_7d[4] & 1) == 0) {
              if ((local_7d[3] & 1) == 0) {
                if ((local_7d[2] & 1) == 0) {
                  format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                  ::$_0::operator()((__0 *)&x_2," %12.5lg","             ",0xd);
                }
                else {
                  format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                  ::$_0::operator()((__0 *)&x_2," %12.5lg","             ",0xd);
                }
              }
              else {
                format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
                ::$_0::operator()((__0 *)&x_2," %12.5lg","             ",0xd);
              }
            }
            else {
              format_data(std::function<void(void_const*,unsigned_long)>,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)
              ::$_0::operator()((__0 *)&x_2," %12.5lg","             ",0xd);
            }
          }
          ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"\n",1);
          ::std::__cxx11::string::~string((string *)&x_4);
        }
        else {
          cVar17 = -(prev_line_buf[10] == '\0');
          cVar18 = -(prev_line_buf[0xb] == '\0');
          cVar19 = -(prev_line_buf[0xc] == '\0');
          cVar20 = -(prev_line_buf[0xd] == '\0');
          cVar21 = -(prev_line_buf[0xe] == '\0');
          cVar22 = -(prev_line_buf[0xf] == '\0');
          cVar23 = -(line_buf[0] == '\0');
          cVar24 = -(line_buf[1] == '\0');
          cVar25 = -(line_buf[2] == '\0');
          cVar26 = -(line_buf[3] == '\0');
          cVar27 = -(line_buf[4] == '\0');
          cVar28 = -(line_buf[5] == '\0');
          cVar29 = -(line_buf[6] == '\0');
          bVar31 = -(line_buf[7] == '\0');
          auVar1[1] = -(prev_line_buf[9] == '\0');
          auVar1[0] = -(prev_line_buf[8] == '\0');
          auVar1[2] = cVar17;
          auVar1[3] = cVar18;
          auVar1[4] = cVar19;
          auVar1[5] = cVar20;
          auVar1[6] = cVar21;
          auVar1[7] = cVar22;
          auVar1[8] = cVar23;
          auVar1[9] = cVar24;
          auVar1[10] = cVar25;
          auVar1[0xb] = cVar26;
          auVar1[0xc] = cVar27;
          auVar1[0xd] = cVar28;
          auVar1[0xe] = cVar29;
          auVar1[0xf] = bVar31;
          auVar2[1] = -(prev_line_buf[9] == '\0');
          auVar2[0] = -(prev_line_buf[8] == '\0');
          auVar2[2] = cVar17;
          auVar2[3] = cVar18;
          auVar2[4] = cVar19;
          auVar2[5] = cVar20;
          auVar2[6] = cVar21;
          auVar2[7] = cVar22;
          auVar2[8] = cVar23;
          auVar2[9] = cVar24;
          auVar2[10] = cVar25;
          auVar2[0xb] = cVar26;
          auVar2[0xc] = cVar27;
          auVar2[0xd] = cVar28;
          auVar2[0xe] = cVar29;
          auVar2[0xf] = bVar31;
          auVar11[1] = cVar18;
          auVar11[0] = cVar17;
          auVar11[2] = cVar19;
          auVar11[3] = cVar20;
          auVar11[4] = cVar21;
          auVar11[5] = cVar22;
          auVar11[6] = cVar23;
          auVar11[7] = cVar24;
          auVar11[8] = cVar25;
          auVar11[9] = cVar26;
          auVar11[10] = cVar27;
          auVar11[0xb] = cVar28;
          auVar11[0xc] = cVar29;
          auVar11[0xd] = bVar31;
          auVar9[1] = cVar19;
          auVar9[0] = cVar18;
          auVar9[2] = cVar20;
          auVar9[3] = cVar21;
          auVar9[4] = cVar22;
          auVar9[5] = cVar23;
          auVar9[6] = cVar24;
          auVar9[7] = cVar25;
          auVar9[8] = cVar26;
          auVar9[9] = cVar27;
          auVar9[10] = cVar28;
          auVar9[0xb] = cVar29;
          auVar9[0xc] = bVar31;
          auVar7[1] = cVar20;
          auVar7[0] = cVar19;
          auVar7[2] = cVar21;
          auVar7[3] = cVar22;
          auVar7[4] = cVar23;
          auVar7[5] = cVar24;
          auVar7[6] = cVar25;
          auVar7[7] = cVar26;
          auVar7[8] = cVar27;
          auVar7[9] = cVar28;
          auVar7[10] = cVar29;
          auVar7[0xb] = bVar31;
          auVar5[1] = cVar21;
          auVar5[0] = cVar20;
          auVar5[2] = cVar22;
          auVar5[3] = cVar23;
          auVar5[4] = cVar24;
          auVar5[5] = cVar25;
          auVar5[6] = cVar26;
          auVar5[7] = cVar27;
          auVar5[8] = cVar28;
          auVar5[9] = cVar29;
          auVar5[10] = bVar31;
          if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar31,CONCAT18(cVar29,CONCAT17(cVar28,CONCAT16(
                                                  cVar27,CONCAT15(cVar26,CONCAT14(cVar25,CONCAT13(
                                                  cVar24,CONCAT12(cVar23,CONCAT11(cVar22,cVar21)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar31,CONCAT17(cVar29,CONCAT16(cVar28,CONCAT15(
                                                  cVar27,CONCAT14(cVar26,CONCAT13(cVar25,CONCAT12(
                                                  cVar24,CONCAT11(cVar23,cVar22)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar31 >> 7) << 0xf) != 0xffff) goto LAB_00115596;
          cVar17 = -(*(char *)(current_iov_index + 1) == '\0');
          cVar18 = -(*(char *)(current_iov_index + 2) == '\0');
          cVar19 = -(*(char *)(current_iov_index + 3) == '\0');
          cVar20 = -(*(char *)(current_iov_index + 4) == '\0');
          cVar21 = -(*(char *)(current_iov_index + 5) == '\0');
          cVar22 = -(*(char *)(current_iov_index + 6) == '\0');
          cVar23 = -(*(char *)(current_iov_index + 7) == '\0');
          cVar24 = -(*(char *)(current_iov_index + 8) == '\0');
          cVar25 = -(*(char *)(current_iov_index + 9) == '\0');
          cVar26 = -(*(char *)(current_iov_index + 10) == '\0');
          cVar27 = -(*(char *)(current_iov_index + 0xb) == '\0');
          cVar28 = -(*(char *)(current_iov_index + 0xc) == '\0');
          cVar29 = -(*(char *)(current_iov_index + 0xd) == '\0');
          cVar30 = -(*(char *)(current_iov_index + 0xe) == '\0');
          bVar31 = -(*(char *)(current_iov_index + 0xf) == '\0');
          auVar3[1] = cVar17;
          auVar3[0] = -(*(char *)current_iov_index == '\0');
          auVar3[2] = cVar18;
          auVar3[3] = cVar19;
          auVar3[4] = cVar20;
          auVar3[5] = cVar21;
          auVar3[6] = cVar22;
          auVar3[7] = cVar23;
          auVar3[8] = cVar24;
          auVar3[9] = cVar25;
          auVar3[10] = cVar26;
          auVar3[0xb] = cVar27;
          auVar3[0xc] = cVar28;
          auVar3[0xd] = cVar29;
          auVar3[0xe] = cVar30;
          auVar3[0xf] = bVar31;
          auVar4[1] = cVar17;
          auVar4[0] = -(*(char *)current_iov_index == '\0');
          auVar4[2] = cVar18;
          auVar4[3] = cVar19;
          auVar4[4] = cVar20;
          auVar4[5] = cVar21;
          auVar4[6] = cVar22;
          auVar4[7] = cVar23;
          auVar4[8] = cVar24;
          auVar4[9] = cVar25;
          auVar4[10] = cVar26;
          auVar4[0xb] = cVar27;
          auVar4[0xc] = cVar28;
          auVar4[0xd] = cVar29;
          auVar4[0xe] = cVar30;
          auVar4[0xf] = bVar31;
          auVar12[1] = cVar19;
          auVar12[0] = cVar18;
          auVar12[2] = cVar20;
          auVar12[3] = cVar21;
          auVar12[4] = cVar22;
          auVar12[5] = cVar23;
          auVar12[6] = cVar24;
          auVar12[7] = cVar25;
          auVar12[8] = cVar26;
          auVar12[9] = cVar27;
          auVar12[10] = cVar28;
          auVar12[0xb] = cVar29;
          auVar12[0xc] = cVar30;
          auVar12[0xd] = bVar31;
          auVar10[1] = cVar20;
          auVar10[0] = cVar19;
          auVar10[2] = cVar21;
          auVar10[3] = cVar22;
          auVar10[4] = cVar23;
          auVar10[5] = cVar24;
          auVar10[6] = cVar25;
          auVar10[7] = cVar26;
          auVar10[8] = cVar27;
          auVar10[9] = cVar28;
          auVar10[10] = cVar29;
          auVar10[0xb] = cVar30;
          auVar10[0xc] = bVar31;
          auVar8[1] = cVar21;
          auVar8[0] = cVar20;
          auVar8[2] = cVar22;
          auVar8[3] = cVar23;
          auVar8[4] = cVar24;
          auVar8[5] = cVar25;
          auVar8[6] = cVar26;
          auVar8[7] = cVar27;
          auVar8[8] = cVar28;
          auVar8[9] = cVar29;
          auVar8[10] = cVar30;
          auVar8[0xb] = bVar31;
          auVar6[1] = cVar22;
          auVar6[0] = cVar21;
          auVar6[2] = cVar23;
          auVar6[3] = cVar24;
          auVar6[4] = cVar25;
          auVar6[5] = cVar26;
          auVar6[6] = cVar27;
          auVar6[7] = cVar28;
          auVar6[8] = cVar29;
          auVar6[9] = cVar30;
          auVar6[10] = bVar31;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar31,CONCAT18(cVar30,CONCAT17(cVar29,CONCAT16(
                                                  cVar28,CONCAT15(cVar27,CONCAT14(cVar26,CONCAT13(
                                                  cVar25,CONCAT12(cVar24,CONCAT11(cVar23,cVar22)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar31,CONCAT17(cVar30,CONCAT16(cVar29,CONCAT15(
                                                  cVar28,CONCAT14(cVar27,CONCAT13(cVar26,CONCAT12(
                                                  cVar25,CONCAT11(cVar24,cVar23)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar31 >> 7) << 0xf) != 0xffff) goto LAB_00115596;
        }
      }
    }
  }
  return;
}

Assistant:

void format_data(
    function<void(const void*, size_t)> write_data,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (num_iovs == 0) {
    return;
  }

  size_t total_size = 0;
  for (size_t x = 0; x < num_iovs; x++) {
    total_size += iovs[x].iov_len;
  }
  if (total_size == 0) {
    return;
  }

  if (num_prev_iovs) {
    size_t total_prev_size = 0;
    for (size_t x = 0; x < num_prev_iovs; x++) {
      total_prev_size += prev_iovs[x].iov_len;
    }
    if (total_prev_size != total_size) {
      throw runtime_error("previous iovs given, but data size does not match");
    }
  }

  uint64_t end_address = start_address + total_size;

  int width_digits;
  if (flags & PrintDataFlags::OFFSET_8_BITS) {
    width_digits = 2;
  } else if (flags & PrintDataFlags::OFFSET_16_BITS) {
    width_digits = 4;
  } else if (flags & PrintDataFlags::OFFSET_32_BITS) {
    width_digits = 8;
  } else if (flags & PrintDataFlags::OFFSET_64_BITS) {
    width_digits = 16;
  } else if (end_address > 0x100000000) {
    width_digits = 16;
  } else if (end_address > 0x10000) {
    width_digits = 8;
  } else if (end_address > 0x100) {
    width_digits = 4;
  } else {
    width_digits = 2;
  }

  bool use_color = flags & PrintDataFlags::USE_COLOR;
  bool print_ascii = flags & PrintDataFlags::PRINT_ASCII;
  bool print_float = flags & PrintDataFlags::PRINT_FLOAT;
  bool print_double = flags & PrintDataFlags::PRINT_DOUBLE;
  bool reverse_endian = flags & PrintDataFlags::REVERSE_ENDIAN_FLOATS;
  bool big_endian = flags & PrintDataFlags::BIG_ENDIAN_FLOATS;
  bool little_endian = flags & PrintDataFlags::LITTLE_ENDIAN_FLOATS;
  bool collapse_zero_lines = flags & PrintDataFlags::COLLAPSE_ZERO_LINES;
  bool skip_separator = flags & PrintDataFlags::SKIP_SEPARATOR;

  // Reserve space for the current/previous line data
  uint8_t line_buf[0x10];
  memset(line_buf, 0, sizeof(line_buf));

  uint8_t prev_line_buf[0x10];
  uint8_t* prev_line_data = prev_line_buf;
  if (num_prev_iovs) {
    memset(prev_line_buf, 0, sizeof(prev_line_buf));
  } else {
    prev_line_data = line_buf;
  }

  size_t current_iov_index = 0;
  size_t current_iov_bytes = 0;
  size_t prev_iov_index = 0;
  size_t prev_iov_bytes = 0;
  for (uint64_t line_start_address = start_address & (~0x0F);
       line_start_address < end_address;
       line_start_address += 0x10) {

    // Figure out the boundaries of the current line
    uint64_t line_end_address = line_start_address + 0x10;
    uint8_t line_invalid_start_bytes = max<int64_t>(start_address - line_start_address, 0);
    uint8_t line_invalid_end_bytes = max<int64_t>(line_end_address - end_address, 0);
    uint8_t line_bytes = 0x10 - line_invalid_end_bytes - line_invalid_start_bytes;

    auto print_fields_column = [&]<typename LoadedDataT, typename StoredDataT>(
                                   const char* field_format,
                                   const void* blank_format,
                                   size_t blank_format_len) -> void {
      write_data(" |", skip_separator ? 1 : 2);

      const auto* line_fields = reinterpret_cast<const StoredDataT*>(line_buf);
      const auto* prev_line_fields = reinterpret_cast<const StoredDataT*>(prev_line_data);
      uint8_t line_invalid_start_fields = (line_invalid_start_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);
      uint8_t line_invalid_end_fields = (line_invalid_end_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);

      constexpr size_t field_count = 0x10 / sizeof(StoredDataT);
      size_t x = 0;
      for (; x < line_invalid_start_fields; x++) {
        write_data(blank_format, blank_format_len);
      }
      for (; x < static_cast<size_t>(field_count - line_invalid_end_fields); x++) {
        LoadedDataT current_value = line_fields[x];
        LoadedDataT previous_value = prev_line_fields[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        string field = string_printf(field_format, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < field_count; x++) {
        write_data(blank_format, blank_format_len);
      }
    };

    // Read the current and previous data for this line
    for (size_t x = 0; x < line_bytes; x++) {
      while (current_iov_bytes >= iovs[current_iov_index].iov_len) {
        current_iov_bytes = 0;
        current_iov_index++;
        if (current_iov_index >= num_iovs) {
          throw logic_error("reads exceeded final iov");
        }
      }
      line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
          iovs[current_iov_index].iov_base)[current_iov_bytes];
      current_iov_bytes++;
    }
    if (num_prev_iovs) {
      for (size_t x = 0; x < line_bytes; x++) {
        while (prev_iov_bytes >= prev_iovs[prev_iov_index].iov_len) {
          prev_iov_bytes = 0;
          prev_iov_index++;
          if (prev_iov_index >= num_prev_iovs) {
            throw logic_error("reads exceeded final prev iov");
          }
        }
        prev_line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
            prev_iovs[prev_iov_index].iov_base)[prev_iov_bytes];
        prev_iov_bytes++;
      }
    }

    if (collapse_zero_lines && (line_start_address > start_address) && (line_end_address < end_address) &&
        !memcmp(line_buf, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16) &&
        !memcmp(prev_line_data, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16)) {
      continue;
    }

    string line = string_printf(skip_separator ? "%0*" PRIX64 : "%0*" PRIX64 " |",
        width_digits, line_start_address);
    write_data(line.data(), line.size());

    {
      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data("   ", 3);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g(write_data, use_color && (previous_value != current_value));
        string field = string_printf(" %02" PRIX8, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < 0x10; x++) {
        write_data("   ", 3);
      }
    }

    if (print_ascii) {
      write_data(" | ", skip_separator ? 1 : 3);

      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data(" ", 1);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        if ((current_value < 0x20) || (current_value >= 0x7F)) {
          InverseTerminalGuard g2(write_data, use_color);
          write_data(" ", 1);
        } else {
          write_data(&current_value, 1);
        }
      }
      for (; x < 0x10; x++) {
        write_data(" ", 1);
      }
    }

    if (print_float) {
      if (reverse_endian) {
        print_fields_column.operator()<float, re_float>(" %12.5g", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<float, be_float>(" %12.5g", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<float, le_float>(" %12.5g", "             ", 13);
      } else {
        print_fields_column.operator()<float, float>(" %12.5g", "             ", 13);
      }
    }
    if (print_double) {
      if (reverse_endian) {
        print_fields_column.operator()<double, re_double>(" %12.5lg", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<double, be_double>(" %12.5lg", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<double, le_double>(" %12.5lg", "             ", 13);
      } else {
        print_fields_column.operator()<double, double>(" %12.5lg", "             ", 13);
      }
    }

    write_data("\n", 1);
  }
}